

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

FIOBJ http_urlstr2fiobj(char *s,size_t len)

{
  FIOBJ o;
  size_t size;
  fio_str_info_s fStack_38;
  
  o = fiobj_str_buf(len);
  fiobj_obj2cstr(&fStack_38,o);
  size = http_decode_url(fStack_38.data,s,len);
  if ((long)size < 0) {
    fiobj_free(o);
    o = fiobj_str_new((char *)0x0,0);
  }
  else {
    fiobj_str_resize(o,size);
  }
  return o;
}

Assistant:

static inline FIOBJ http_urlstr2fiobj(char *s, size_t len) {
  FIOBJ o = fiobj_str_buf(len);
  ssize_t l = http_decode_url(fiobj_obj2cstr(o).data, s, len);
  if (l < 0) {
    fiobj_free(o);
    return fiobj_str_new(NULL, 0); /* empty string */
  }
  fiobj_str_resize(o, (size_t)l);
  return o;
}